

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolui.c
# Opt level: O1

int ffpgpui(fitsfile *fptr,long group,long firstelem,long nelem,unsigned_short *array,int *status)

{
  LONGLONG firstrow;
  
  firstrow = 1;
  if (1 < group) {
    firstrow = group;
  }
  ffpclui(fptr,1,firstrow,firstelem,nelem,array,status);
  return *status;
}

Assistant:

int ffpgpui( fitsfile *fptr,   /* I - FITS file pointer                      */
            long  group,      /* I - group to write(1 = 1st group)          */
            long  firstelem,  /* I - first vector element to write(1 = 1st) */
            long  nelem,      /* I - number of values to write              */
   unsigned short *array,     /* I - array of values that are written       */
            int  *status)     /* IO - error status                          */
/*
  Write an array of group parameters to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being written).
*/
{
    long row;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffpclui(fptr, 1L, row, firstelem, nelem, array, status);
    return(*status);
}